

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O2

void memory_tree_ns::end_pass(memory_tree *b)

{
  ostream *poVar1;
  
  b->current_pass = b->current_pass + 1;
  poVar1 = std::operator<<((ostream *)&std::cout,"######### Current Pass: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,", with number of memories strored so far: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void end_pass(memory_tree& b){
        b.current_pass ++;
        cout<<"######### Current Pass: "<<b.current_pass<<", with number of memories strored so far: "<<b.examples.size()<<endl;
    }